

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexStats.cpp
# Opt level: O2

RegexStats * __thiscall
UnifiedRegex::RegexStatsDatabase::GetRegexStats(RegexStatsDatabase *this,RegexPattern *pattern)

{
  bool bVar1;
  RegexStats *this_00;
  undefined1 local_38 [8];
  InternalString str;
  RegexStats *res;
  
  RegexPattern::GetSource((RegexPattern *)local_38);
  bVar1 = JsUtil::
          BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<Js::InternalString>
                    (this->map,(InternalString *)local_38,(RegexStats **)&str.m_content);
  if (!bVar1) {
    this_00 = (RegexStats *)new<Memory::ArenaAllocator>(0x80,this->allocator,0x35916e);
    RegexStats::RegexStats(this_00,pattern);
    str.m_content.ptr = (char16_t *)this_00;
    JsUtil::
    BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                *)this->map,(InternalString *)local_38,(RegexStats **)&str.m_content);
  }
  return (RegexStats *)str.m_content.ptr;
}

Assistant:

RegexStats* RegexStatsDatabase::GetRegexStats(RegexPattern* pattern)
    {
        Js::InternalString str = pattern->GetSource();
        RegexStats *res;
        if (!map->TryGetValue(str, &res))
        {
            res = Anew(allocator, RegexStats, pattern);
            map->Add(str, res);
        }
        return res;
    }